

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_push.c
# Opt level: O0

ssize_t mpt_stream_push(mpt_stream *stream,size_t len,void *src)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  long lVar3;
  char *local_78;
  char *local_70;
  char *local_68;
  ulong local_60;
  size_t rem;
  size_t add;
  char *fmt;
  ssize_t post;
  char *pcStack_30;
  int flags;
  ssize_t total;
  void *src_local;
  size_t len_local;
  mpt_stream *stream_local;
  
  pcStack_30 = (char *)0x0;
  post._4_4_ = mpt_stream_flags(&stream->_info);
  total = (ssize_t)src;
  src_local = (void *)len;
  if ((post._4_4_ & 0x80) != 0) {
    post._4_4_ = post._4_4_ & 0xffffffdf;
  }
  while( true ) {
    while( true ) {
      if (src_local == (void *)0x0) {
        if ((stream->_wd)._enc == (mpt_data_encoder_t)0x0) {
          sVar1 = (stream->_wd).data.max;
          sVar2 = (stream->_wd).data.len;
          __s = (char *)mpt_newline_string((int)(post._4_4_ & 0xc000) >> 0xe);
          if (__s == (char *)0x0) {
            local_60 = 0;
          }
          else {
            local_60 = strlen(__s);
          }
          if (local_60 <= sVar1 - sVar2) {
            if (__s != (char *)0x0) {
              mpt_queue_push(&stream->_wd,local_60,__s);
            }
            mpt_queue_push(&stream->_wd,0);
            (stream->_info)._fd = (stream->_info)._fd & 0xfffffffffffffffb;
            return 0;
          }
          fmt = (char *)0xffffffffffffffef;
        }
        else {
          fmt = (char *)mpt_queue_push(&stream->_wd,0);
          if (-1 < (long)fmt) {
            (stream->_info)._fd = (stream->_info)._fd & 0xfffffffffffffffb;
            return (ssize_t)fmt;
          }
        }
      }
      else {
        fmt = (char *)mpt_queue_push(&stream->_wd,src_local,total);
      }
      if ((long)fmt < 0) break;
      (stream->_info)._fd = (stream->_info)._fd | 4;
      pcStack_30 = fmt + (long)pcStack_30;
      src_local = (void *)((long)src_local - (long)fmt);
      if (src_local == (void *)0x0) {
        return (ssize_t)pcStack_30;
      }
      total = (ssize_t)(fmt + total);
    }
    if (fmt != (char *)0xffffffffffffffef) {
      if (pcStack_30 == (char *)0x0) {
        local_68 = fmt;
      }
      else {
        local_68 = pcStack_30;
      }
      return (ssize_t)local_68;
    }
    if (((post._4_4_ & 0x20) == 0) || ((post._4_4_ & 0x80) != 0)) break;
    lVar3 = mpt_queue_prepare(&stream->_wd,0x100);
    if (lVar3 == 0) {
      if (pcStack_30 == (char *)0x0) {
        local_78 = (char *)0xfffffffffffffffc;
      }
      else {
        local_78 = pcStack_30;
      }
      return (ssize_t)local_78;
    }
  }
  if (pcStack_30 == (char *)0x0) {
    local_70 = (char *)0xffffffffffffffff;
  }
  else {
    local_70 = pcStack_30;
  }
  return (ssize_t)local_70;
}

Assistant:

extern ssize_t mpt_stream_push(MPT_STRUCT(stream) *stream, size_t len, const void *src)
{
	ssize_t total = 0;
	int flags = mpt_stream_flags(&stream->_info);
	
	if (flags & MPT_STREAMFLAG(WriteMap)) {
		flags &= ~MPT_STREAMFLAG(WriteBuf);
	}
	
	while (1) {
		ssize_t post;
		
		/* error during data append */
		if (len) {
			post = mpt_queue_push(&stream->_wd, len, src);
		}
		/* terminate current message */
		else {
			if (!stream->_wd._enc) {
				const char *fmt;
				size_t add, rem;
				
				rem = stream->_wd.data.max - stream->_wd.data.len;
				fmt = mpt_newline_string(MPT_stream_newline_write(flags));
				add = fmt ? strlen(fmt) : 0;
				if (rem >= add) {
					if (fmt) {
						mpt_queue_push(&stream->_wd, add, fmt);
					}
					/* mark segment as done */
					mpt_queue_push(&stream->_wd, 0, 0);
					stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
					return 0;
				}
				post = MPT_ERROR(MissingBuffer);
			}
			else if ((post = mpt_queue_push(&stream->_wd, 0, 0)) >= 0) {
				stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
				return post;
			}
		}
		/* pushed some data */
		if (post >= 0) {
			stream->_info._fd |= MPT_STREAMFLAG(MesgActive);
			total += post;
			/* push operation finished */
			if (!(len -= post)) {
				return total;
			}
			src = ((uint8_t *) src) + post;
			continue;
		}
		/* incompatible error state */
		if (post != MPT_ERROR(MissingBuffer)) {
			return total ? total : post;
		}
		/* queue not resizable */
		if (!(flags & MPT_STREAMFLAG(WriteBuf))
		    || (flags & MPT_STREAMFLAG(WriteMap))) {
			return total ? total : MPT_ERROR(BadArgument);
		}
		/* append queue data */
		if (!mpt_queue_prepare(&stream->_wd.data, 256)) {
			return total ? total : MPT_ERROR(BadOperation);
		}
	}
}